

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

void Abc_NtkDontCareSimulateSetElem2(Odc_Man_t *p)

{
  uint uVar1;
  uint *puVar2;
  void *__s;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  if (0 < p->nVarsMax) {
    uVar5 = 0;
    do {
      if (p->nPis <= (int)uVar5) {
        __assert_fail("i >= 0 && i < p->nPis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                      ,0x72,"Odc_Lit_t Odc_Var(Odc_Man_t *, int)");
      }
      uVar1 = uVar5 + 1;
      if (p->vTruths->nSize <= (int)(uVar1 & 0x7fff)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      __s = p->vTruths->pArray[uVar1 & 0x7fff];
      memset(__s,0,(long)p->nWords << 2);
      iVar4 = p->nBits;
      if (0 < iVar4) {
        uVar3 = 0;
        do {
          if ((uVar3 & 1 << ((byte)uVar5 & 0x1f)) != 0) {
            puVar2 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
            *puVar2 = *puVar2 | 1 << ((byte)uVar3 & 0x1f);
            iVar4 = p->nBits;
          }
          uVar3 = uVar3 + 1;
        } while ((int)uVar3 < iVar4);
      }
      uVar5 = uVar1;
    } while ((int)uVar1 < p->nVarsMax);
  }
  return;
}

Assistant:

void Abc_NtkDontCareSimulateSetElem2( Odc_Man_t * p )
{
    unsigned * pData;
    int i, k;
    for ( k = 0; k < p->nVarsMax; k++ )
    {
        pData = Odc_ObjTruth( p, Odc_Var(p, k) );
        Abc_InfoClear( pData, p->nWords );
        for ( i = 0; i < p->nBits; i++ )
            if ( i & (1 << k) )
                pData[i>>5] |= (1 << (i&31));
    }
}